

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhSetEmptyPage(lhpage *pPage)

{
  uchar *puVar1;
  int iVar2;
  ushort uVar3;
  
  puVar1 = pPage->pRaw->zData;
  iVar2 = (*pPage->pHash->pIo->xWrite)(pPage->pRaw);
  if (iVar2 == 0) {
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    (pPage->sHdr).iFree = 0xc;
    puVar1[2] = '\0';
    puVar1[3] = '\f';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    uVar3 = (short)pPage->pHash->iPageSize - 0xc;
    *(ushort *)(puVar1 + 0xe) = uVar3 * 0x100 | uVar3 >> 8;
    pPage->nFree = uVar3;
    (*pPage->pHash->pIo->xDontMkHot)(pPage->pRaw);
  }
  return iVar2;
}

Assistant:

static int lhSetEmptyPage(lhpage *pPage)
{
	unsigned char *zRaw = pPage->pRaw->zData;
	lhphdr *pHeader = &pPage->sHdr;
	sxu16 nByte;
	int rc;
	/* Acquire a writer lock */
	rc = pPage->pHash->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Offset of the first cell */
	SyBigEndianPack16(zRaw,0);
	zRaw += 2;
	/* Offset of the first free block */
	pHeader->iFree = L_HASH_PAGE_HDR_SZ;
	SyBigEndianPack16(zRaw,L_HASH_PAGE_HDR_SZ);
	zRaw += 2;
	/* Slave page number */
	SyBigEndianPack64(zRaw,0);
	zRaw += 8;
	/* Fill the free block */
	SyBigEndianPack16(zRaw,0); /* Offset of the next free block */
	zRaw += 2;
	nByte = (sxu16)L_HASH_MX_FREE_SPACE(pPage->pHash->iPageSize);
	SyBigEndianPack16(zRaw,nByte);
	pPage->nFree = nByte;
	/* Do not add this page to the hot dirty list */
	pPage->pHash->pIo->xDontMkHot(pPage->pRaw);
	return UNQLITE_OK;
}